

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall
Js::JavascriptLibrary::SetCrossSiteForLockedNonBuiltInFunctionType
          (JavascriptLibrary *this,JavascriptFunction *function)

{
  FunctionProxy *pFVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  ScriptFunctionType *pSVar5;
  ScriptContext *pSVar6;
  ScriptFunction *pSVar7;
  undefined4 extraout_var;
  PathTypeHandlerBase *pPVar8;
  DynamicTypeHandler *pDVar9;
  DynamicType *local_30;
  DynamicType *type;
  DynamicTypeHandler *typeHandler;
  FunctionProxy *functionProxy;
  JavascriptFunction *function_local;
  JavascriptLibrary *this_local;
  
  functionProxy = (FunctionProxy *)function;
  function_local = (JavascriptFunction *)this;
  typeHandler = (DynamicTypeHandler *)JavascriptFunction::GetFunctionProxy(function);
  type = (DynamicType *)DynamicObject::GetTypeHandler((DynamicObject *)functionProxy);
  iVar3 = (*(*(_func_int ***)&type->super_Type)[0x4d])();
  if (iVar3 == 0) {
    if ((typeHandler == (DynamicTypeHandler *)0x0) ||
       (pSVar5 = FunctionProxy::GetCrossSiteUndeferredFunctionType((FunctionProxy *)typeHandler),
       pFVar1 = functionProxy, pSVar5 == (ScriptFunctionType *)0x0)) {
      iVar3 = (**(code **)(*(long *)&type->super_Type + 0x270))();
      if (iVar3 == 0) {
        DynamicObject::ChangeType((DynamicObject *)functionProxy);
      }
      else {
        bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,ShareCrossSiteFuncTypesPhase);
        if (bVar2) {
          pPVar8 = PathTypeHandlerBase::FromTypeHandler((DynamicTypeHandler *)type);
          PathTypeHandlerBase::ConvertToNonShareableTypeHandler
                    (pPVar8,(DynamicObject *)functionProxy);
        }
        else {
          iVar3 = (*(functionProxy->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x67])();
          local_30 = (DynamicType *)CONCAT44(extraout_var,iVar3);
          pPVar8 = PathTypeHandlerBase::FromTypeHandler((DynamicTypeHandler *)type);
          PathTypeHandlerBase::BuildPathTypeFromNewRoot
                    (pPVar8,(DynamicObject *)functionProxy,&local_30);
          DynamicObject::ReplaceType((DynamicObject *)functionProxy,local_30);
        }
      }
      pFVar1 = functionProxy;
      pSVar6 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                         (&(this->super_JavascriptLibraryBase).scriptContext);
      JavascriptFunction::SetEntryPoint((JavascriptFunction *)pFVar1,pSVar6->CurrentCrossSiteThunk);
      if ((typeHandler != (DynamicTypeHandler *)0x0) &&
         (BVar4 = FunctionProxy::HasParseableInfo((FunctionProxy *)typeHandler), BVar4 != 0)) {
        pDVar9 = DynamicObject::GetTypeHandler((DynamicObject *)functionProxy);
        bVar2 = DynamicTypeHandler::GetMayBecomeShared(pDVar9);
        if ((bVar2) &&
           (bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,ShareCrossSiteFuncTypesPhase), !bVar2)
           ) {
          DynamicObject::ShareType((DynamicObject *)functionProxy);
          pDVar9 = typeHandler;
          pSVar7 = UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>
                             ((JavascriptFunction *)functionProxy);
          pSVar5 = ScriptFunction::GetScriptFunctionType(pSVar7);
          FunctionProxy::SetCrossSiteUndeferredFunctionType((FunctionProxy *)pDVar9,pSVar5);
        }
      }
    }
    else {
      pSVar5 = FunctionProxy::GetCrossSiteUndeferredFunctionType((FunctionProxy *)typeHandler);
      DynamicObject::ReplaceType((DynamicObject *)pFVar1,&pSVar5->super_DynamicType);
    }
  }
  else if ((typeHandler == (DynamicTypeHandler *)0x0) ||
          (pSVar5 = FunctionProxy::GetCrossSiteDeferredFunctionType((FunctionProxy *)typeHandler),
          pFVar1 = functionProxy, pSVar5 == (ScriptFunctionType *)0x0)) {
    DynamicObject::ChangeType((DynamicObject *)functionProxy);
    pFVar1 = functionProxy;
    pSVar6 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                       (&(this->super_JavascriptLibraryBase).scriptContext);
    JavascriptFunction::SetEntryPoint((JavascriptFunction *)pFVar1,pSVar6->CurrentCrossSiteThunk);
    if ((typeHandler != (DynamicTypeHandler *)0x0) &&
       ((BVar4 = FunctionProxy::HasParseableInfo((FunctionProxy *)typeHandler), BVar4 != 0 &&
        (bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,ShareCrossSiteFuncTypesPhase), !bVar2))))
    {
      DynamicObject::ShareType((DynamicObject *)functionProxy);
      pDVar9 = typeHandler;
      pSVar7 = UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>
                         ((JavascriptFunction *)functionProxy);
      pSVar5 = ScriptFunction::GetScriptFunctionType(pSVar7);
      FunctionProxy::SetCrossSiteDeferredFunctionType((FunctionProxy *)pDVar9,pSVar5);
    }
  }
  else {
    pSVar5 = FunctionProxy::GetCrossSiteDeferredFunctionType((FunctionProxy *)typeHandler);
    DynamicObject::ReplaceType((DynamicObject *)pFVar1,&pSVar5->super_DynamicType);
  }
  return;
}

Assistant:

void JavascriptLibrary::SetCrossSiteForLockedNonBuiltInFunctionType(JavascriptFunction * function)
    {
        FunctionProxy * functionProxy = function->GetFunctionProxy();
        DynamicTypeHandler *typeHandler = function->GetTypeHandler();
        if (typeHandler->IsDeferredTypeHandler())
        {
            if (functionProxy && functionProxy->GetCrossSiteDeferredFunctionType())
            {
                function->ReplaceType(functionProxy->GetCrossSiteDeferredFunctionType());
            }
            else
            {
                function->ChangeType();
                function->SetEntryPoint(scriptContext->CurrentCrossSiteThunk);
                if (functionProxy && functionProxy->HasParseableInfo() && !PHASE_OFF1(ShareCrossSiteFuncTypesPhase))
                {
                    function->ShareType();
                    functionProxy->SetCrossSiteDeferredFunctionType(UnsafeVarTo<ScriptFunction>(function)->GetScriptFunctionType());
                }
            }
        }
        else 
        {
            if (functionProxy && functionProxy->GetCrossSiteUndeferredFunctionType())
            {
                function->ReplaceType(functionProxy->GetCrossSiteUndeferredFunctionType());
            }
            else
            {
                if (typeHandler->IsPathTypeHandler())
                {
                    if (!PHASE_OFF1(ShareCrossSiteFuncTypesPhase))
                    {
                        DynamicType *type = function->DuplicateType();
                        PathTypeHandlerBase::FromTypeHandler(typeHandler)->BuildPathTypeFromNewRoot(function, &type);
                        function->ReplaceType(type);
                    }
                    else
                    {
                        PathTypeHandlerBase::FromTypeHandler(typeHandler)->ConvertToNonShareableTypeHandler(function);
                    }
                }
                else
                {
                    function->ChangeType();
                }
                function->SetEntryPoint(scriptContext->CurrentCrossSiteThunk);
                if (functionProxy && functionProxy->HasParseableInfo() && function->GetTypeHandler()->GetMayBecomeShared() && !PHASE_OFF1(ShareCrossSiteFuncTypesPhase))
                {
                    function->ShareType();
                    functionProxy->SetCrossSiteUndeferredFunctionType(UnsafeVarTo<ScriptFunction>(function)->GetScriptFunctionType());
                }
            }
        }
    }